

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O2

Address * __thiscall Address::operator=(Address *this,Address *b)

{
  uint i;
  ulong uVar1;
  uint uVar2;
  
  uVar2 = b->depth;
  this->depth = uVar2;
  for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 1) {
    this->labels[uVar1] = b->labels[uVar1];
    this->childNums[uVar1] = b->childNums[uVar1];
    uVar2 = this->depth;
  }
  this->leader = 0;
  return this;
}

Assistant:

Address &operator=(const Address &b) {
    depth = b.depth;
    for (unsigned i = 0; i < depth; i++) {
      labels[i] = b.labels[i];
      childNums[i] = b.childNums[i];
    }
    leader = FALSE;
    return *this;
  }